

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::truncate
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this,char *__file,
          __off_t __length)

{
  AuxNode *pAVar1;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar2;
  char *pcVar3;
  AuxNode *target;
  size_t size_local;
  ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    pAVar1 = this->ptr;
    while (pAVar1 + (long)__file < this->pos) {
      pRVar2 = this->pos;
      this->pos = pRVar2 + -1;
      dtor<capnp::compiler::NodeTranslator::AuxNode>(pRVar2 + -1);
    }
    return (int)this->pos;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b8,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }